

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_internal.h
# Opt level: O0

void ZSTD_wildcopy(void *dst,void *src,ptrdiff_t length)

{
  BYTE *oend;
  BYTE *op;
  BYTE *ip;
  ptrdiff_t length_local;
  void *src_local;
  void *dst_local;
  
  oend = (BYTE *)dst;
  op = (BYTE *)src;
  do {
    ZSTD_copy8(oend,op);
    oend = oend + 8;
    op = op + 8;
  } while (oend < (BYTE *)((long)dst + length));
  return;
}

Assistant:

MEM_STATIC void ZSTD_wildcopy(void* dst, const void* src, ptrdiff_t length)
{
    const BYTE* ip = (const BYTE*)src;
    BYTE* op = (BYTE*)dst;
    BYTE* const oend = op + length;
    do
        COPY8(op, ip)
    while (op < oend);
}